

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::_::PointerBuilder::getCapability(PointerBuilder *this)

{
  int iVar1;
  _func_int **pp_Var2;
  undefined8 uVar3;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  char *pcVar4;
  ClientHook *extraout_RDX_01;
  ClientHook *pCVar5;
  long in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> OVar6;
  BrokenCapFactory *brokenCapFactory;
  Fault f;
  DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> _kjCondition;
  undefined1 local_48 [16];
  DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> local_38;
  
  local_38.left = (BrokenCapFactory **)local_48;
  local_48._0_8_ = globalBrokenCapFactory;
  local_38.right = (CapTableBuilder *)0x0;
  local_38.op.content.ptr = " != ";
  local_38.op.content.size_ = 5;
  local_38.result = globalBrokenCapFactory != (Arena *)0x0;
  if (globalBrokenCapFactory == (Arena *)0x0) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::_::BrokenCapFactory*&,decltype(nullptr)>&,char_const(&)[192]>
              ((Fault *)(local_48 + 8),
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0x8b5,FAILED,"brokenCapFactory != nullptr",
               "_kjCondition,\"Trying to read capabilities without ever having created a capability context.  \" \"To read capabilities from a message, you must imbue it with CapReaderContext, or \" \"use the Cap\'n Proto RPC system.\""
               ,(DebugComparison<capnp::_::BrokenCapFactory_*&,_std::nullptr_t> *)(local_48 + 0x10),
               (char (*) [192])
               "Trying to read capabilities without ever having created a capability context.  To read capabilities from a message, you must imbue it with CapReaderContext, or use the Cap\'n Proto RPC system."
              );
    kj::_::Debug::Fault::fatal((Fault *)(local_48 + 8));
  }
  iVar1 = **(int **)(in_RSI + 0x10);
  if ((*(int **)(in_RSI + 0x10))[1] == 0 && iVar1 == 0) {
    (*globalBrokenCapFactory->_vptr_Arena[1])(this,globalBrokenCapFactory);
    pCVar5 = extraout_RDX_00;
  }
  else {
    if (iVar1 == 3) {
      (**(code **)**(undefined8 **)(in_RSI + 8))(local_48 + 0x10);
      if ((CapTableBuilder *)local_38.right != (CapTableBuilder *)0x0) {
        this->segment = (SegmentBuilder *)local_38.left;
        this->capTable = (CapTableBuilder *)local_38.right;
        pCVar5 = extraout_RDX;
        goto LAB_00358612;
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[45]>
                ((Fault *)(local_48 + 0x10),
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8c4,FAILED,(char *)0x0,"\"Message contains invalid capability pointer.\"",
                 (char (*) [45])"Message contains invalid capability pointer.");
      kj::_::Debug::Fault::~Fault((Fault *)(local_48 + 0x10));
      pp_Var2 = *(_func_int ***)local_48._0_8_;
      pcVar4 = "Calling invalid capability pointer.";
      uVar3 = 0x24;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[96]>
                ((Fault *)(local_48 + 0x10),
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x8bc,FAILED,(char *)0x0,
                 "\"Schema mismatch: Message contains non-capability pointer where capability pointer was \" \"expected.\""
                 ,(char (*) [96])
                  "Schema mismatch: Message contains non-capability pointer where capability pointer was expected."
                );
      kj::_::Debug::Fault::~Fault((Fault *)(local_48 + 0x10));
      pp_Var2 = *(_func_int ***)local_48._0_8_;
      pcVar4 = "Calling capability extracted from a non-capability pointer.";
      uVar3 = 0x3c;
    }
    (**pp_Var2)(this,local_48._0_8_,pcVar4,uVar3);
    pCVar5 = extraout_RDX_01;
  }
LAB_00358612:
  OVar6.ptr = pCVar5;
  OVar6.disposer = (Disposer *)this;
  return OVar6;
}

Assistant:

kj::Own<ClientHook> PointerBuilder::getCapability() {
  return WireHelpers::readCapabilityPointer(
      segment, capTable, pointer, kj::maxValue);
}